

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int32_t iVar1;
  undefined4 uVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  parasail_result_t *ppVar18;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  int32_t *piVar23;
  ulong uVar24;
  char *pcVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  char *__format;
  uint uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [16];
  undefined1 auVar49 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  int32_t *local_408;
  ulong local_3a0;
  ulong local_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  ulong local_378;
  long local_370;
  long local_368;
  undefined1 local_360 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  int local_1e0;
  int iStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int iStack_1c8;
  int iStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  int local_120;
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  int local_100;
  int iStack_fc;
  int iStack_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int iStack_e8;
  int iStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "_s2";
LAB_0075814a:
    fprintf(_stderr,__format,"parasail_sg_flags_table_diag_avx2_256_32",pcVar25);
    return (parasail_result_t *)0x0;
  }
  uVar39 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar25 = "s2Len";
    goto LAB_0075814a;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "open";
    goto LAB_0075814a;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "gap";
    goto LAB_0075814a;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "matrix";
    goto LAB_0075814a;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "_s1";
      goto LAB_0075814a;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar25 = "_s1Len";
      goto LAB_0075814a;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  uVar37 = s2Len + 7;
  iVar33 = -open;
  iVar14 = matrix->min;
  uVar20 = 0x80000000 - iVar14;
  if (iVar14 != iVar33 && SBORROW4(iVar14,iVar33) == iVar14 + open < 0) {
    uVar20 = open | 0x80000000;
  }
  iVar30 = uVar20 + 1;
  iVar29 = 0x7ffffffe - matrix->max;
  iVar14 = gap * 8;
  local_2a0 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  local_1c0 = local_2a0;
  if (s1_beg == 0) {
    local_1c0._4_4_ = iVar14;
    local_1c0._0_4_ = iVar14;
    local_1c0._8_4_ = iVar14;
    local_1c0._12_4_ = iVar14;
    local_1c0._16_4_ = iVar14;
    local_1c0._20_4_ = iVar14;
    local_1c0._24_4_ = iVar14;
    local_1c0._28_4_ = iVar14;
  }
  local_200._0_8_ = CONCAT44(iVar30,iVar30);
  local_200._8_8_ = CONCAT44(iVar30,iVar30);
  local_200._16_8_ = CONCAT44(iVar30,iVar30);
  local_200._24_8_ = CONCAT44(iVar30,iVar30);
  local_220._8_8_ = local_200._8_8_;
  local_220._0_8_ = local_200._0_8_;
  local_220._16_8_ = local_200._16_8_;
  local_220._24_8_ = local_200._24_8_;
  local_1a0._8_8_ = local_200._8_8_;
  local_1a0._0_8_ = local_200._0_8_;
  local_1a0._16_8_ = local_200._16_8_;
  local_1a0._24_8_ = local_200._24_8_;
  local_240._8_8_ = local_200._8_8_;
  local_240._0_8_ = local_200._0_8_;
  local_240._16_8_ = local_200._16_8_;
  local_240._24_8_ = local_200._24_8_;
  if (s1_beg == 0) {
    iVar14 = iVar33 - gap;
    iVar26 = iVar33 + gap * -2;
    iVar19 = gap * -3 - open;
    auVar50 = vpinsrd_avx(ZEXT416((uint)(gap * -7)),gap * -6,1);
    auVar50 = vpinsrd_avx(auVar50,gap * -5,2);
    auVar50 = vpinsrd_avx(auVar50,iVar33,3);
    auVar7 = vpinsrd_avx(ZEXT416((uint)open),gap * 4,1);
    auVar7 = vpshufd_avx(auVar7,0x40);
    auVar50 = vpsubd_avx(auVar50,auVar7);
    auVar41._4_4_ = iVar19;
    auVar41._0_4_ = iVar19;
    auVar41._8_4_ = iVar19;
    auVar41._12_4_ = iVar19;
    auVar41._16_4_ = iVar19;
    auVar41._20_4_ = iVar19;
    auVar41._24_4_ = iVar19;
    auVar41._28_4_ = iVar19;
    auVar41 = vpblendd_avx2(ZEXT1632(auVar50),auVar41,0x10);
    auVar42._4_4_ = iVar26;
    auVar42._0_4_ = iVar26;
    auVar42._8_4_ = iVar26;
    auVar42._12_4_ = iVar26;
    auVar42._16_4_ = iVar26;
    auVar42._20_4_ = iVar26;
    auVar42._24_4_ = iVar26;
    auVar42._28_4_ = iVar26;
    auVar41 = vpblendd_avx2(auVar41,auVar42,0x20);
    auVar43._4_4_ = iVar14;
    auVar43._0_4_ = iVar14;
    auVar43._8_4_ = iVar14;
    auVar43._12_4_ = iVar14;
    auVar43._16_4_ = iVar14;
    auVar43._20_4_ = iVar14;
    auVar43._24_4_ = iVar14;
    auVar43._28_4_ = iVar14;
    auVar41 = vpblendd_avx2(auVar41,auVar43,0x40);
    auVar44._4_4_ = iVar33;
    auVar44._0_4_ = iVar33;
    auVar44._8_4_ = iVar33;
    auVar44._12_4_ = iVar33;
    auVar44._16_4_ = iVar33;
    auVar44._20_4_ = iVar33;
    auVar44._24_4_ = iVar33;
    auVar44._28_4_ = iVar33;
    local_2a0 = vpblendd_avx2(auVar41,auVar44,0x80);
  }
  ppVar18 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar18 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar18->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x8421002;
  uVar27 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int32_t(0x20,uVar27);
  ptr_00 = parasail_memalign_int32_t(0x20,uVar27);
  ptr_01 = parasail_memalign_int32_t(0x20,uVar27);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  lVar40 = (long)_s1Len;
  if (matrix->type == 0) {
    local_408 = parasail_memalign_int32_t(0x20,(long)(int)(_s1Len + 7));
    if (local_408 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    for (uVar27 = 0; lVar22 = lVar40, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar27;
        uVar27 = uVar27 + 1) {
      local_408[uVar27] = matrix->mapper[(byte)_s1[uVar27]];
    }
    for (; lVar22 < (int)(_s1Len + 7); lVar22 = lVar22 + 1) {
      local_408[lVar22] = 0;
    }
  }
  else {
    local_408 = (int32_t *)0x0;
  }
  local_c0._4_4_ = _s1Len;
  local_c0._0_4_ = _s1Len;
  local_c0._8_4_ = _s1Len;
  local_c0._12_4_ = _s1Len;
  local_c0._16_4_ = _s1Len;
  local_c0._20_4_ = _s1Len;
  local_c0._24_4_ = _s1Len;
  local_c0._28_4_ = _s1Len;
  auVar41 = vpcmpeqd_avx2(ZEXT432((uint)_s1Len),ZEXT432((uint)_s1Len));
  local_e0._4_4_ = s2Len;
  local_e0._0_4_ = s2Len;
  local_e0._8_4_ = s2Len;
  local_e0._12_4_ = s2Len;
  local_e0._16_4_ = s2Len;
  local_e0._20_4_ = s2Len;
  local_e0._24_4_ = s2Len;
  local_e0._28_4_ = s2Len;
  local_1e0 = iVar29;
  iStack_1dc = iVar29;
  iStack_1d8 = iVar29;
  iStack_1d4 = iVar29;
  iStack_1d0 = iVar29;
  iStack_1cc = iVar29;
  iStack_1c8 = iVar29;
  iStack_1c4 = iVar29;
  local_100 = open;
  iStack_fc = open;
  iStack_f8 = open;
  iStack_f4 = open;
  iStack_f0 = open;
  iStack_ec = open;
  iStack_e8 = open;
  iStack_e4 = open;
  local_120 = gap;
  iStack_11c = gap;
  iStack_118 = gap;
  iStack_114 = gap;
  iStack_110 = gap;
  iStack_10c = gap;
  iStack_108 = gap;
  iStack_104 = gap;
  local_160 = vpaddd_avx2(local_c0,auVar41);
  local_140 = vpaddd_avx2(local_e0,auVar41);
  piVar4 = matrix->mapper;
  for (uVar27 = 0; uVar39 != uVar27; uVar27 = uVar27 + 1) {
    ptr[uVar27 + 7] = piVar4[(byte)_s2[uVar27]];
  }
  for (lVar22 = 0; lVar22 != 7; lVar22 = lVar22 + 1) {
    ptr[lVar22] = 0;
  }
  piVar23 = ptr + uVar39 + 7;
  for (uVar27 = uVar39; (int)uVar27 < (int)uVar37; uVar27 = (ulong)((int)uVar27 + 1)) {
    *piVar23 = 0;
    piVar23 = piVar23 + 1;
  }
  uVar27 = 0;
  iVar14 = iVar33;
  if (s2_beg == 0) {
    for (; uVar39 != uVar27; uVar27 = uVar27 + 1) {
      ptr_00[uVar27 + 7] = iVar14;
      ptr_01[uVar27 + 7] = iVar30;
      iVar14 = iVar14 - gap;
    }
  }
  else {
    for (; uVar39 != uVar27; uVar27 = uVar27 + 1) {
      ptr_00[uVar27 + 7] = 0;
      ptr_01[uVar27 + 7] = iVar30;
    }
  }
  for (lVar22 = 0; uVar27 = uVar39, lVar22 != 7; lVar22 = lVar22 + 1) {
    ptr_00[lVar22] = iVar30;
    ptr_01[lVar22] = iVar30;
  }
  for (; (int)uVar27 < (int)uVar37; uVar27 = uVar27 + 1) {
    ptr_00[uVar27 + 7] = iVar30;
    ptr_01[uVar27 + 7] = iVar30;
  }
  ptr_00[6] = 0;
  uVar20 = _s1Len - 1;
  local_260._4_4_ = iVar30;
  local_260._0_4_ = iVar30;
  local_260._8_4_ = iVar30;
  local_260._12_4_ = iVar30;
  local_260._16_4_ = iVar30;
  local_260._20_4_ = iVar30;
  local_260._24_4_ = iVar30;
  local_260._28_4_ = iVar30;
  local_180 = vpalignr_avx2(ZEXT1632(local_260._16_16_),local_260,4);
  auVar52 = ZEXT3264(local_200);
  auVar55 = ZEXT3264(local_220);
  lVar22 = uVar39 * 4;
  local_370 = uVar39 * 0xc + -0xc;
  local_360 = vpmovsxbd_avx2(ZEXT816(0x1020304050607));
  local_368 = 0;
  auVar45 = ZEXT3264(local_260);
  auVar53 = ZEXT3264(local_260);
  uVar27 = 0;
  auVar51 = ZEXT3264(local_260);
  auVar57 = ZEXT3264(local_260);
  auVar58 = ZEXT3264(local_260);
  local_280._4_4_ = iVar29;
  local_280._0_4_ = iVar29;
  local_280._12_4_ = iVar29;
  local_280._8_4_ = iVar29;
  local_280._20_4_ = iVar29;
  local_280._16_4_ = iVar29;
  local_280._28_4_ = iVar29;
  local_280._24_4_ = iVar29;
  while ((long)uVar27 < lVar40) {
    uVar24 = uVar27 | 3;
    uVar38 = (uint)uVar27;
    if (matrix->type == 0) {
      uVar36 = local_408[uVar27 + 1];
      uVar15 = local_408[uVar27 + 2];
      uVar21 = local_408[uVar24];
      uVar16 = local_408[uVar27 + 4];
      uVar32 = local_408[uVar27 + 5];
      uVar17 = local_408[uVar27 + 6];
      uVar34 = local_408[uVar27];
      uVar31 = local_408[uVar27 + 7];
    }
    else {
      uVar36 = uVar20;
      if ((long)(uVar27 | 1) < lVar40) {
        uVar36 = uVar38 | 1;
      }
      uVar15 = uVar38 | 2;
      if (lVar40 <= (long)(uVar27 | 2)) {
        uVar15 = uVar20;
      }
      uVar21 = uVar38 | 3;
      if (lVar40 <= (long)uVar24) {
        uVar21 = uVar20;
      }
      uVar16 = uVar38 | 4;
      if (lVar40 <= (long)(uVar27 | 4)) {
        uVar16 = uVar20;
      }
      uVar32 = uVar38 | 5;
      if (lVar40 <= (long)(uVar27 | 5)) {
        uVar32 = uVar20;
      }
      uVar17 = uVar38 | 6;
      if (lVar40 <= (long)(uVar27 | 6)) {
        uVar17 = uVar20;
      }
      uVar34 = uVar38;
      uVar31 = uVar38 | 7;
      if (lVar40 <= (long)(uVar27 | 7)) {
        uVar31 = uVar20;
      }
    }
    local_378 = uVar27 | 1;
    local_380 = uVar27 | 6;
    local_388 = uVar27 | 2;
    local_390 = uVar27 | 4;
    local_398 = uVar27 | 5;
    local_3a0 = uVar27 | 7;
    piVar4 = matrix->matrix;
    iVar14 = matrix->size;
    iVar19 = iVar33 - uVar38 * gap;
    iVar1 = ptr_00[6];
    auVar46._4_4_ = iVar1;
    auVar46._0_4_ = iVar1;
    auVar46._8_4_ = iVar1;
    auVar46._12_4_ = iVar1;
    auVar46._16_4_ = iVar1;
    auVar46._20_4_ = iVar1;
    auVar46._24_4_ = iVar1;
    auVar46._28_4_ = iVar1;
    auVar41 = vpblendd_avx2(local_180,auVar46,0x80);
    if (s1_beg != 0) {
      iVar19 = 0;
    }
    auVar47._4_4_ = iVar19;
    auVar47._0_4_ = iVar19;
    auVar47._8_4_ = iVar19;
    auVar47._12_4_ = iVar19;
    auVar47._16_4_ = iVar19;
    auVar47._20_4_ = iVar19;
    auVar47._24_4_ = iVar19;
    auVar47._28_4_ = iVar19;
    auVar42 = vpblendd_avx2(local_180,auVar47,0x80);
    uVar27 = uVar27 + 8;
    ptr_00[6] = iVar33 - (int)uVar27 * gap;
    local_a0 = vpcmpeqd_avx2(local_360,local_160);
    auVar6._4_4_ = iVar30;
    auVar6._0_4_ = iVar30;
    auVar6._8_4_ = iVar30;
    auVar6._12_4_ = iVar30;
    auVar6._16_4_ = iVar30;
    auVar6._20_4_ = iVar30;
    auVar6._24_4_ = iVar30;
    auVar6._28_4_ = iVar30;
    auVar44 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
    auVar43 = auVar6;
    for (uVar28 = 0; (~((int)uVar37 >> 0x1f) & uVar37) != uVar28; uVar28 = uVar28 + 1) {
      auVar50 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar21 * iVar14) +
                                                 (long)ptr[uVar28 + 4]]),
                            piVar4[(long)(int)(uVar15 * iVar14) + (long)ptr[uVar28 + 5]],1);
      auVar50 = vpinsrd_avx(auVar50,piVar4[(long)(int)(uVar36 * iVar14) + (long)ptr[uVar28 + 6]],2);
      auVar50 = vpinsrd_avx(auVar50,piVar4[(long)(int)(uVar34 * iVar14) + (long)ptr[uVar28 + 7]],3);
      auVar7 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar31 * iVar14) + (long)ptr[uVar28]]),
                           piVar4[(long)(int)(uVar17 * iVar14) + (long)ptr[uVar28 + 1]],1);
      auVar7 = vpinsrd_avx(auVar7,piVar4[(long)(int)(uVar32 * iVar14) + (long)ptr[uVar28 + 2]],2);
      auVar7 = vpinsrd_avx(auVar7,piVar4[(long)(int)(uVar16 * iVar14) + (long)ptr[uVar28 + 3]],3);
      auVar46 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
      auVar47 = vpermd_avx2(auVar46,auVar42);
      iVar1 = ptr_00[uVar28 + 7];
      auVar54._4_4_ = iVar1;
      auVar54._0_4_ = iVar1;
      auVar54._8_4_ = iVar1;
      auVar54._12_4_ = iVar1;
      auVar54._16_4_ = iVar1;
      auVar54._20_4_ = iVar1;
      auVar54._24_4_ = iVar1;
      auVar54._28_4_ = iVar1;
      auVar54 = vpblendd_avx2(auVar47,auVar54,0x80);
      auVar43 = vpermd_avx2(auVar46,auVar43);
      iVar1 = ptr_01[uVar28 + 7];
      auVar56._4_4_ = iVar1;
      auVar56._0_4_ = iVar1;
      auVar56._8_4_ = iVar1;
      auVar56._12_4_ = iVar1;
      auVar56._16_4_ = iVar1;
      auVar56._20_4_ = iVar1;
      auVar56._24_4_ = iVar1;
      auVar56._28_4_ = iVar1;
      auVar46 = vpblendd_avx2(auVar43,auVar56,0x80);
      auVar9._4_4_ = open;
      auVar9._0_4_ = open;
      auVar9._8_4_ = open;
      auVar9._12_4_ = open;
      auVar9._16_4_ = open;
      auVar9._20_4_ = open;
      auVar9._24_4_ = open;
      auVar9._28_4_ = open;
      auVar43 = vpsubd_avx2(auVar54,auVar9);
      auVar8._4_4_ = gap;
      auVar8._0_4_ = gap;
      auVar8._8_4_ = gap;
      auVar8._12_4_ = gap;
      auVar8._16_4_ = gap;
      auVar8._20_4_ = gap;
      auVar8._24_4_ = gap;
      auVar8._28_4_ = gap;
      auVar46 = vpsubd_avx2(auVar46,auVar8);
      auVar43 = vpmaxsd_avx2(auVar43,auVar46);
      auVar42 = vpsubd_avx2(auVar42,auVar9);
      auVar46 = vpsubd_avx2(auVar6,auVar8);
      auVar46 = vpmaxsd_avx2(auVar42,auVar46);
      auVar48._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar7;
      auVar48._16_16_ = ZEXT116(1) * auVar50;
      auVar41 = vpaddd_avx2(auVar41,auVar48);
      auVar42 = vpmaxsd_avx2(auVar46,auVar43);
      auVar47 = vpmaxsd_avx2(auVar41,auVar42);
      auVar41 = vpcmpeqd_avx2(auVar44,_DAT_008a5a80);
      auVar42 = vblendvps_avx(auVar47,local_2a0,auVar41);
      if (7 < uVar28) {
        local_280 = vpminsd_avx2(local_280,auVar42);
        local_260 = vpmaxsd_avx2(local_260,auVar42);
      }
      piVar5 = ((ppVar18->field_4).rowcols)->score_row;
      auVar50 = auVar42._16_16_;
      if (uVar28 < uVar39) {
        uVar2 = vextractps_avx(auVar50,3);
        *(undefined4 *)((long)piVar5 + uVar28 * 4 + local_368) = uVar2;
      }
      if (uVar28 - 1 < uVar39 && (long)local_378 < lVar40) {
        uVar2 = vextractps_avx(auVar50,2);
        *(undefined4 *)((long)piVar5 + uVar28 * 4 + lVar22 * local_378 + -4) = uVar2;
      }
      if (((long)local_388 < lVar40) && ((long)(uVar28 - 2) < (long)uVar39 && 1 < uVar28)) {
        uVar2 = vextractps_avx(auVar50,1);
        *(undefined4 *)((long)piVar5 + uVar28 * 4 + lVar22 * local_388 + -8) = uVar2;
      }
      if (((long)uVar24 < lVar40) && ((long)(uVar28 - 3) < (long)uVar39 && 2 < uVar28)) {
        *(int *)((long)piVar5 + uVar28 * 4 + local_370) = auVar42._16_4_;
      }
      if (((long)local_390 < lVar40) && ((long)(uVar28 - 4) < (long)uVar39 && 3 < uVar28)) {
        *(int *)((long)piVar5 + uVar28 * 4 + lVar22 * local_390 + -0x10) = auVar42._12_4_;
      }
      if (((long)local_398 < lVar40) && ((long)(uVar28 - 5) < (long)uVar39 && 4 < uVar28)) {
        *(int *)((long)piVar5 + uVar28 * 4 + lVar22 * local_398 + -0x14) = auVar42._8_4_;
      }
      if (((long)local_380 < lVar40) && ((long)(uVar28 - 6) < (long)uVar39 && 5 < uVar28)) {
        *(int *)((long)piVar5 + uVar28 * 4 + lVar22 * local_380 + -0x18) = auVar42._4_4_;
      }
      auVar10._4_4_ = iVar30;
      auVar10._0_4_ = iVar30;
      auVar10._8_4_ = iVar30;
      auVar10._12_4_ = iVar30;
      auVar10._16_4_ = iVar30;
      auVar10._20_4_ = iVar30;
      auVar10._24_4_ = iVar30;
      auVar10._28_4_ = iVar30;
      auVar43 = vblendvps_avx(auVar43,auVar10,auVar41);
      if (6 < uVar28 && (long)local_3a0 < lVar40) {
        *(int32_t *)((long)piVar5 + uVar28 * 4 + lVar22 * local_3a0 + -0x1c) = auVar42._0_4_;
      }
      auVar11._4_4_ = iVar30;
      auVar11._0_4_ = iVar30;
      auVar11._8_4_ = iVar30;
      auVar11._12_4_ = iVar30;
      auVar11._16_4_ = iVar30;
      auVar11._20_4_ = iVar30;
      auVar11._24_4_ = iVar30;
      auVar11._28_4_ = iVar30;
      auVar6 = vblendvps_avx(auVar46,auVar11,auVar41);
      auVar41 = vpcmpgtd_avx2(local_e0,auVar44);
      auVar46 = vpcmpgtd_avx2(auVar42,auVar53._0_32_);
      auVar41 = vpandn_avx2(auVar44,auVar41);
      auVar41 = vpand_avx2(auVar41,local_a0);
      auVar8 = vpand_avx2(auVar46,auVar41);
      auVar9 = vpcmpgtd_avx2(local_c0,local_360);
      auVar41 = vblendvps_avx(auVar53._0_32_,auVar47,auVar8);
      auVar52 = ZEXT3264(auVar41);
      auVar46 = vpcmpeqd_avx2(auVar44,local_140);
      auVar47 = vpand_avx2(auVar9,auVar46);
      auVar46 = vpand_avx2(auVar46,local_a0);
      auVar46 = vblendvps_avx(auVar58._0_32_,auVar42,auVar46);
      auVar58 = ZEXT3264(auVar46);
      auVar46 = vpcmpgtd_avx2(auVar42,auVar45._0_32_);
      auVar47 = vpand_avx2(auVar47,auVar46);
      ptr_00[uVar28] = auVar42._0_4_;
      ptr_01[uVar28] = auVar43._0_4_;
      auVar46 = vblendvps_avx(auVar45._0_32_,auVar42,auVar47);
      auVar55 = ZEXT3264(auVar46);
      auVar47 = vblendvps_avx(auVar57._0_32_,local_360,auVar47);
      auVar57 = ZEXT3264(auVar47);
      auVar47 = vblendvps_avx(auVar51._0_32_,auVar44,auVar8);
      auVar51 = ZEXT3264(auVar47);
      auVar44 = vpsubd_avx2(auVar44,_DAT_008a5a80);
      auVar45 = ZEXT3264(auVar46);
      auVar53 = ZEXT3264(auVar41);
      auVar41 = auVar54;
    }
    auVar49._8_4_ = 8;
    auVar49._0_8_ = 0x800000008;
    auVar49._12_4_ = 8;
    auVar49._16_4_ = 8;
    auVar49._20_4_ = 8;
    auVar49._24_4_ = 8;
    auVar49._28_4_ = 8;
    local_360 = vpaddd_avx2(local_360,auVar49);
    local_2a0 = vpsubd_avx2(local_2a0,local_1c0);
    local_370 = local_370 + uVar39 * 0x20;
    local_368 = local_368 + uVar39 * 0x20;
  }
  local_200 = auVar52._0_32_;
  local_220 = auVar55._0_32_;
  local_1a0 = auVar58._0_32_;
  local_240 = auVar57._0_32_;
  local_80[0] = auVar51._0_32_;
  iVar14 = 0;
  uVar37 = 0;
  iVar33 = iVar30;
  iVar26 = iVar30;
  iVar19 = iVar30;
  for (lVar40 = 0; (int)lVar40 != 8; lVar40 = lVar40 + 1) {
    iVar3 = *(int *)(local_220 + lVar40 * 4);
    if (iVar26 < iVar3) {
      uVar37 = *(uint *)(local_240 + lVar40 * 4);
      iVar26 = iVar3;
    }
    else if ((iVar3 == iVar26) && ((int)*(uint *)(local_240 + lVar40 * 4) < (int)uVar37)) {
      uVar37 = *(uint *)(local_240 + lVar40 * 4);
      iVar26 = iVar3;
    }
    if (iVar33 < *(int *)(local_200 + lVar40 * 4)) {
      iVar14 = *(int *)(local_80[0] + lVar40 * 4);
      iVar33 = *(int *)(local_200 + lVar40 * 4);
    }
    if (iVar19 < *(int *)(local_1a0 + lVar40 * 4)) {
      iVar19 = *(int *)(local_1a0 + lVar40 * 4);
    }
  }
  iVar3 = iVar14;
  if (s1_end == 0 || s2_end == 0) {
    iVar35 = s2Len + -1;
    if (s1_end != 0) goto LAB_0075806b;
    iVar3 = iVar35;
    if (s2_end != 0) {
      iVar3 = iVar14;
      iVar19 = iVar33;
    }
  }
  else {
    if (iVar33 < iVar26) {
      iVar35 = s2Len + -1;
      goto LAB_0075806b;
    }
    iVar19 = iVar33;
    if ((iVar26 == iVar33) && (iVar35 = s2Len + -1, iVar14 == iVar35)) goto LAB_0075806b;
  }
  iVar26 = iVar19;
  iVar35 = iVar3;
  uVar37 = uVar20;
LAB_0075806b:
  auVar12._4_4_ = iVar30;
  auVar12._0_4_ = iVar30;
  auVar12._8_4_ = iVar30;
  auVar12._12_4_ = iVar30;
  auVar12._16_4_ = iVar30;
  auVar12._20_4_ = iVar30;
  auVar12._24_4_ = iVar30;
  auVar12._28_4_ = iVar30;
  auVar41 = vpcmpgtd_avx2(auVar12,local_280);
  auVar13._4_4_ = iVar29;
  auVar13._0_4_ = iVar29;
  auVar13._8_4_ = iVar29;
  auVar13._12_4_ = iVar29;
  auVar13._16_4_ = iVar29;
  auVar13._20_4_ = iVar29;
  auVar13._24_4_ = iVar29;
  auVar13._28_4_ = iVar29;
  auVar42 = vpcmpgtd_avx2(local_260,auVar13);
  auVar41 = vpor_avx2(auVar41,auVar42);
  if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar41 >> 0x7f,0) != '\0') ||
        (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar41 >> 0xbf,0) != '\0') ||
      (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar41[0x1f] < '\0') {
    *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
    iVar26 = 0;
    iVar35 = 0;
    uVar37 = 0;
  }
  ppVar18->score = iVar26;
  ppVar18->end_query = uVar37;
  ppVar18->end_ref = iVar35;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_408);
    return ppVar18;
  }
  return ppVar18;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = s1_beg ? _mm256_set1_epi32(0) : _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi32(0) : _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi32(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi32(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi32_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi32(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi32(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}